

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample_x86::forward
          (GridSample_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _elempack;
  Mat *src;
  Mat *this_00;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int x;
  float *pfVar19;
  void *pvVar20;
  char *__ptr;
  int *offset_ptr;
  float *pfVar21;
  int iVar22;
  long lVar23;
  int i;
  int iVar24;
  int *offset_ptr_2;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  size_t sStackY_200;
  Mat local_1b8;
  Mat local_168;
  __m128 y_coeffs3;
  __m128 y_coeffs2;
  __m128 y_coeffs1;
  __m128 y_coeffs0;
  __m128 x_coeffs3;
  __m128 x_coeffs2;
  __m128 x_coeffs1;
  __m128 x_coeffs0;
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined1 auStack_7c [4];
  __m128 value_f [4];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _elempack = src->elempack;
  iVar14 = src->c;
  iVar22 = src->dims;
  sVar5 = src->elemsize;
  local_1b8.cstep = 0;
  local_1b8.data = (float *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8._20_8_ = 0;
  local_168.cstep = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  if (src[1].elempack == 1) {
    if (&local_168 != src + 1) {
      piVar6 = src[1].refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      local_168.data = src[1].data;
      local_168.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_168.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_168.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_168.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_168.elempack = src[1].elempack;
      local_168.allocator = src[1].allocator;
      local_168.dims = src[1].dims;
      local_168.w = src[1].w;
      local_168.h = src[1].h;
      local_168.d = src[1].d;
      local_168.c = src[1].c;
      local_168.cstep = src[1].cstep;
    }
  }
  else {
    convert_packing(src + 1,&local_168,1,opt);
  }
  iVar24 = -100;
  if (iVar22 == 3) {
    iVar12 = local_168.h;
    iVar13 = local_168.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar12 = local_168.c;
      iVar13 = local_168.h;
    }
    Mat::create(this_00,iVar13,iVar12,iVar14,sVar5,_elempack,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0052c638;
    iVar14 = (this->super_GridSample).sample_type;
    if (iVar14 == 1) {
      Mat::create(&local_1b8,iVar13,iVar12,sVar5 * 6,6,opt->workspace_allocator);
      if (((float *)local_1b8.data == (float *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
      goto LAB_0052c638;
      iVar14 = (this->super_GridSample).padding_mode;
      if (iVar14 == 3) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
LAB_0052b77e:
        iVar14 = (this->super_GridSample).sample_type;
        goto LAB_0052b789;
      }
      if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052b77e;
      }
      if (iVar14 == 1) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052b77e;
      }
LAB_0052c60e:
      fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
      fputc(10,_stderr);
      goto LAB_0052c638;
    }
LAB_0052b789:
    if (iVar14 == 2) {
      Mat::create(&local_1b8,iVar13,iVar12,1,sVar5,1,opt->workspace_allocator);
      if (((float *)local_1b8.data == (float *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
      goto LAB_0052c638;
      iVar14 = (this->super_GridSample).padding_mode;
      if (iVar14 == 3) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
      else if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
      else {
        if (iVar14 != 1) goto LAB_0052c60e;
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_1b8,iVar13,iVar12,sVar5 * 0x12,0x12,opt->workspace_allocator);
      if (((float *)local_1b8.data == (float *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
      goto LAB_0052c638;
      iVar14 = (this->super_GridSample).padding_mode;
      if (iVar14 == 3) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
      else if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
      else {
        if (iVar14 != 1) {
LAB_0052c6b2:
          iVar24 = -100;
          fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
          fputc(10,_stderr);
          goto LAB_0052c638;
        }
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
      }
    }
LAB_0052bb89:
    bVar25 = false;
  }
  else {
    if (iVar22 != 4) goto LAB_0052bb89;
    iVar24 = local_168.d;
    iVar12 = local_168.w;
    iVar13 = local_168.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar24 = local_168.c;
      iVar12 = local_168.h;
      iVar13 = local_168.d;
    }
    Mat::create(this_00,iVar12,iVar13,iVar24,iVar14,sVar5,_elempack,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
LAB_0052c608:
      iVar24 = -100;
      goto LAB_0052c638;
    }
    iVar14 = (this->super_GridSample).sample_type;
    if (iVar14 == 1) {
      Mat::create(&local_1b8,iVar12,iVar13,iVar24,sVar5 * 0xb,0xb,opt->workspace_allocator);
      if (((float *)local_1b8.data == (float *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0))
      goto LAB_0052c608;
      iVar14 = (this->super_GridSample).padding_mode;
      if (iVar14 == 3) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
LAB_0052ba20:
        iVar14 = (this->super_GridSample).sample_type;
        goto LAB_0052ba2b;
      }
      if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052ba20;
      }
      if (iVar14 == 1) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052ba20;
      }
      __ptr = "gridsample padding_mode error\n";
      sStackY_200 = 0x1e;
LAB_0052c5f4:
      fwrite(__ptr,sStackY_200,1,_stderr);
      fputc(10,_stderr);
      goto LAB_0052c608;
    }
LAB_0052ba2b:
    if (iVar14 != 2) goto LAB_0052c5c8;
    Mat::create(&local_1b8,iVar12,iVar13,iVar24,1,sVar5,1,opt->workspace_allocator);
    if ((float *)local_1b8.data == (float *)0x0) goto LAB_0052c608;
    iVar24 = -100;
    if ((long)local_1b8.c * local_1b8.cstep == 0) goto LAB_0052c638;
    iVar14 = (this->super_GridSample).padding_mode;
    if (iVar14 != 3) {
      if (iVar14 == 2) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052c5c8;
      }
      if (iVar14 == 1) {
        iVar14 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_168,&local_1b8,iVar14);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_168,&local_1b8,iVar14);
        }
        goto LAB_0052c5c8;
      }
      goto LAB_0052c6b2;
    }
    iVar14 = (this->super_GridSample).permute_fusion;
    if ((this->super_GridSample).align_corner == 0) {
      gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                (src,&local_168,&local_1b8,iVar14);
    }
    else {
      gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                (src,&local_168,&local_1b8,iVar14);
    }
LAB_0052c5c8:
    bVar25 = true;
    if ((this->super_GridSample).sample_type == 3) {
      __ptr = "unsupported bicubic when dims == 4";
      sStackY_200 = 0x22;
      goto LAB_0052c5f4;
    }
  }
  pvVar7 = local_1b8.data;
  iVar14 = 0;
  iVar24 = iVar14;
  if (_elempack == 1) {
    if (iVar22 == 3) {
      iVar14 = (this->super_GridSample).sample_type;
      if (iVar14 == 3) {
        iVar14 = this_00->h * this_00->w;
        pvVar20 = src->data;
        sVar5 = src->elemsize;
        sVar8 = src->cstep;
        pvVar11 = this_00->data;
        sVar9 = this_00->elemsize;
        sVar10 = this_00->cstep;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar17 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar17 = 0;
        }
        for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
          lVar23 = sVar5 * sVar8 * uVar18;
          pfVar19 = (float *)(sVar9 * sVar10 * uVar18 + (long)pvVar11);
          pfVar21 = (float *)pvVar7;
          for (iVar22 = 0; iVar22 != iVar14; iVar22 = iVar22 + 1) {
            cubic_interp1d(x_coeffs0,x_coeffs1,x_coeffs2,x_coeffs3,*pfVar21);
            cubic_interp1d(y_coeffs0,y_coeffs1,y_coeffs2,y_coeffs3,pfVar21[1]);
            for (lVar15 = 2; lVar15 != 0x12; lVar15 = lVar15 + 4) {
              fVar33 = 0.0;
              fVar32 = 0.0;
              if (-1 < (long)(int)pfVar21[lVar15]) {
                fVar32 = *(float *)((long)pvVar20 + (long)(int)pfVar21[lVar15] * 4 + lVar23);
              }
              if (-1 < (long)(int)pfVar21[lVar15 + 1]) {
                fVar33 = *(float *)((long)pvVar20 + (long)(int)pfVar21[lVar15 + 1] * 4 + lVar23);
              }
              fVar31 = 0.0;
              fVar29 = 0.0;
              if (-1 < (long)(int)pfVar21[lVar15 + 2]) {
                fVar29 = *(float *)((long)pvVar20 + (long)(int)pfVar21[lVar15 + 2] * 4 + lVar23);
              }
              if (-1 < (long)(int)pfVar21[lVar15 + 3]) {
                fVar31 = *(float *)((long)pvVar20 + (long)(int)pfVar21[lVar15 + 3] * 4 + lVar23);
              }
              *(float *)((long)value_f[-1] + lVar15 + 0xe) =
                   fVar31 * x_coeffs3[0] + fVar32 * x_coeffs0[0] +
                   fVar29 * x_coeffs2[0] + fVar33 * x_coeffs1[0];
            }
            *pfVar19 = y_coeffs3[0] * value_f[0][3] + y_coeffs1[0] * value_f[0][1] +
                       y_coeffs2[0] * value_f[0][2] + y_coeffs0[0] * value_f[0][0];
            pfVar19 = pfVar19 + 1;
            pfVar21 = pfVar21 + 0x12;
          }
        }
LAB_0052c577:
        iVar24 = 0;
        goto LAB_0052c638;
      }
      if (iVar14 != 2) {
        if (iVar14 == 1) {
          iVar14 = this_00->h * this_00->w;
          pvVar7 = src->data;
          sVar5 = src->elemsize;
          sVar8 = src->cstep;
          pvVar20 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          uVar17 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar17 = 0;
          }
          for (uVar18 = 0; iVar24 = 0, uVar18 != uVar17; uVar18 = uVar18 + 1) {
            lVar15 = sVar5 * sVar8 * uVar18;
            pfVar21 = (float *)local_1b8.data;
            for (lVar23 = 0; iVar14 != (int)lVar23; lVar23 = lVar23 + 1) {
              fVar33 = 0.0;
              fVar32 = 0.0;
              if (-1 < (long)(int)*pfVar21) {
                fVar32 = *(float *)((long)pvVar7 + (long)(int)*pfVar21 * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[1]) {
                fVar33 = *(float *)((long)pvVar7 + (long)(int)pfVar21[1] * 4 + lVar15);
              }
              fVar31 = 0.0;
              fVar29 = 0.0;
              if (-1 < (long)(int)pfVar21[2]) {
                fVar29 = *(float *)((long)pvVar7 + (long)(int)pfVar21[2] * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[3]) {
                fVar31 = *(float *)((long)pvVar7 + (long)(int)pfVar21[3] * 4 + lVar15);
              }
              fVar26 = pfVar21[4];
              fVar32 = fVar26 * fVar33 + fVar32 * (1.0 - fVar26);
              *(float *)((long)pvVar20 + lVar23 * 4) =
                   ((fVar26 * fVar31 + fVar29 * (1.0 - fVar26)) - fVar32) * pfVar21[5] + fVar32;
              pfVar21 = pfVar21 + 6;
            }
            pvVar20 = (void *)((long)pvVar20 + sVar9 * sVar10);
          }
        }
        goto LAB_0052c638;
      }
    }
    else {
      if (!bVar25) goto LAB_0052c638;
      iVar14 = (this->super_GridSample).sample_type;
      if (iVar14 != 2) {
        if (iVar14 == 1) {
          iVar14 = this_00->h * this_00->w * this_00->d;
          pvVar7 = src->data;
          sVar5 = src->elemsize;
          sVar8 = src->cstep;
          pvVar20 = this_00->data;
          sVar9 = this_00->elemsize;
          sVar10 = this_00->cstep;
          iVar24 = 0;
          if (iVar14 < 1) {
            iVar14 = iVar24;
          }
          uVar17 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar17 = 0;
          }
          for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
            lVar15 = sVar5 * sVar8 * uVar18;
            pfVar21 = (float *)local_1b8.data;
            for (lVar23 = 0; iVar14 != (int)lVar23; lVar23 = lVar23 + 1) {
              fVar33 = 0.0;
              fVar32 = 0.0;
              if (-1 < (long)(int)*pfVar21) {
                fVar32 = *(float *)((long)pvVar7 + (long)(int)*pfVar21 * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[1]) {
                fVar33 = *(float *)((long)pvVar7 + (long)(int)pfVar21[1] * 4 + lVar15);
              }
              fVar31 = 0.0;
              fVar29 = 0.0;
              if (-1 < (long)(int)pfVar21[2]) {
                fVar29 = *(float *)((long)pvVar7 + (long)(int)pfVar21[2] * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[3]) {
                fVar31 = *(float *)((long)pvVar7 + (long)(int)pfVar21[3] * 4 + lVar15);
              }
              fVar27 = 0.0;
              fVar26 = 0.0;
              if (-1 < (long)(int)pfVar21[4]) {
                fVar26 = *(float *)((long)pvVar7 + (long)(int)pfVar21[4] * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[5]) {
                fVar27 = *(float *)((long)pvVar7 + (long)(int)pfVar21[5] * 4 + lVar15);
              }
              fVar30 = 0.0;
              fVar28 = 0.0;
              if (-1 < (long)(int)pfVar21[6]) {
                fVar28 = *(float *)((long)pvVar7 + (long)(int)pfVar21[6] * 4 + lVar15);
              }
              if (-1 < (long)(int)pfVar21[7]) {
                fVar30 = *(float *)((long)pvVar7 + (long)(int)pfVar21[7] * 4 + lVar15);
              }
              fVar38 = pfVar21[8];
              fVar39 = pfVar21[9];
              fVar40 = 1.0 - fVar38;
              fVar32 = (fVar31 * fVar38 + fVar29 * fVar40) * fVar39 +
                       (fVar33 * fVar38 + fVar32 * fVar40) * (1.0 - fVar39);
              *(float *)((long)pvVar20 + lVar23 * 4) =
                   (((fVar38 * fVar30 + fVar28 * fVar40) * fVar39 +
                    (fVar38 * fVar27 + fVar26 * fVar40) * (1.0 - fVar39)) - fVar32) * pfVar21[10] +
                   fVar32;
              pfVar21 = pfVar21 + 0xb;
            }
            pvVar20 = (void *)((long)pvVar20 + sVar9 * sVar10);
          }
        }
        goto LAB_0052c638;
      }
    }
    gridsample_nearest_apply_interpolation_p1(src,this_00,&local_1b8,(Option *)(ulong)_elempack);
  }
  else {
    iVar24 = 0;
    if (_elempack != 4) goto LAB_0052c638;
    if (iVar22 == 3) {
      iVar22 = (this->super_GridSample).sample_type;
      if (iVar22 == 3) {
        iVar14 = this_00->h * this_00->w;
        uVar17 = 0;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar18 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar18 = uVar17;
        }
        for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
          lVar23 = src->cstep * uVar17 * src->elemsize;
          pvVar7 = src->data;
          pfVar19 = (float *)(this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
          pfVar21 = (float *)local_1b8.data;
          for (iVar22 = 0; iVar22 != iVar14; iVar22 = iVar22 + 1) {
            local_88 = *pfVar21;
            fStack_84 = local_88;
            fStack_80 = local_88;
            auStack_7c = (undefined1  [4])local_88;
            cubic_interp1d_p4(&x_coeffs0,&x_coeffs1,&x_coeffs2,&x_coeffs3,(__m128 *)&local_88);
            local_88 = pfVar21[1];
            fStack_84 = local_88;
            fStack_80 = local_88;
            auStack_7c = (undefined1  [4])local_88;
            cubic_interp1d_p4(&y_coeffs0,&y_coeffs1,&y_coeffs2,&y_coeffs3,(__m128 *)&local_88);
            for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 0x10) {
              lVar16 = (long)*(int *)((long)pfVar21 + lVar15 + 8);
              fVar26 = 0.0;
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar30 = 0.0;
              fVar32 = 0.0;
              fVar33 = 0.0;
              fVar29 = 0.0;
              fVar31 = 0.0;
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar7 + lVar16 * 4 + lVar23);
                fVar32 = *pfVar1;
                fVar33 = pfVar1[1];
                fVar29 = pfVar1[2];
                fVar31 = pfVar1[3];
              }
              lVar16 = (long)*(int *)((long)pfVar21 + lVar15 + 0xc);
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar7 + lVar16 * 4 + lVar23);
                fVar26 = *pfVar1;
                fVar27 = pfVar1[1];
                fVar28 = pfVar1[2];
                fVar30 = pfVar1[3];
              }
              lVar16 = (long)*(int *)((long)pfVar21 + lVar15 + 0x10);
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar7 + lVar16 * 4 + lVar23);
                fVar38 = *pfVar1;
                fVar39 = pfVar1[1];
                fVar40 = pfVar1[2];
                fVar41 = pfVar1[3];
              }
              lVar16 = (long)*(int *)((long)pfVar21 + lVar15 + 0x14);
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar7 + lVar16 * 4 + lVar23);
                fVar34 = *pfVar1;
                fVar35 = pfVar1[1];
                fVar36 = pfVar1[2];
                fVar37 = pfVar1[3];
              }
              *(float *)((long)value_f[0] + lVar15) =
                   fVar38 * x_coeffs2[0] + fVar34 * x_coeffs3[0] +
                   fVar26 * x_coeffs1[0] + fVar32 * x_coeffs0[0];
              *(float *)((long)value_f[0] + lVar15 + 4) =
                   fVar39 * x_coeffs2[1] + fVar35 * x_coeffs3[1] +
                   fVar27 * x_coeffs1[1] + fVar33 * x_coeffs0[1];
              *(float *)((long)value_f[0] + lVar15 + 8) =
                   fVar40 * x_coeffs2[2] + fVar36 * x_coeffs3[2] +
                   fVar28 * x_coeffs1[2] + fVar29 * x_coeffs0[2];
              *(float *)((long)value_f[0] + lVar15 + 0xc) =
                   fVar41 * x_coeffs2[3] + fVar37 * x_coeffs3[3] +
                   fVar30 * x_coeffs1[3] + fVar31 * x_coeffs0[3];
            }
            *pfVar19 = value_f[3][0] * y_coeffs3[0] + value_f[2][0] * y_coeffs2[0] +
                       value_f[1][0] * y_coeffs1[0] + value_f[0][0] * y_coeffs0[0];
            pfVar19[1] = value_f[3][1] * y_coeffs3[1] + value_f[2][1] * y_coeffs2[1] +
                         value_f[1][1] * y_coeffs1[1] + value_f[0][1] * y_coeffs0[1];
            pfVar19[2] = value_f[3][2] * y_coeffs3[2] + value_f[2][2] * y_coeffs2[2] +
                         value_f[1][2] * y_coeffs1[2] + value_f[0][2] * y_coeffs0[2];
            pfVar19[3] = value_f[3][3] * y_coeffs3[3] + value_f[2][3] * y_coeffs2[3] +
                         value_f[1][3] * y_coeffs1[3] + value_f[0][3] * y_coeffs0[3];
            pfVar19 = pfVar19 + 4;
            pfVar21 = pfVar21 + 0x12;
          }
        }
        goto LAB_0052c577;
      }
      if (iVar22 != 2) {
        iVar24 = iVar14;
        if (iVar22 == 1) {
          iVar14 = this_00->h * this_00->w;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          uVar17 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar17 = 0;
          }
          for (uVar18 = 0; iVar24 = 0, uVar18 != uVar17; uVar18 = uVar18 + 1) {
            lVar23 = src->cstep * uVar18 * src->elemsize;
            pvVar7 = src->data;
            pfVar19 = (float *)(this_00->cstep * uVar18 * this_00->elemsize + (long)this_00->data);
            pfVar21 = (float *)local_1b8.data;
            iVar22 = iVar14;
            while (bVar25 = iVar22 != 0, iVar22 = iVar22 + -1, bVar25) {
              fVar26 = 0.0;
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar30 = 0.0;
              fVar32 = 0.0;
              fVar33 = 0.0;
              fVar29 = 0.0;
              fVar31 = 0.0;
              if (-1 < (long)(int)*pfVar21) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)*pfVar21 * 4 + lVar23);
                fVar32 = *pfVar1;
                fVar33 = pfVar1[1];
                fVar29 = pfVar1[2];
                fVar31 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[1]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[1] * 4 + lVar23);
                fVar26 = *pfVar1;
                fVar27 = pfVar1[1];
                fVar28 = pfVar1[2];
                fVar30 = pfVar1[3];
              }
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              if (-1 < (long)(int)pfVar21[2]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[2] * 4 + lVar23);
                fVar38 = *pfVar1;
                fVar39 = pfVar1[1];
                fVar40 = pfVar1[2];
                fVar41 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[3]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[3] * 4 + lVar23);
                fVar34 = *pfVar1;
                fVar35 = pfVar1[1];
                fVar36 = pfVar1[2];
                fVar37 = pfVar1[3];
              }
              fVar50 = pfVar21[4];
              fVar51 = pfVar21[5];
              fVar32 = fVar26 * fVar50 + (fVar32 - fVar50 * fVar32);
              fVar33 = fVar27 * fVar50 + (fVar33 - fVar50 * fVar33);
              fVar29 = fVar28 * fVar50 + (fVar29 - fVar50 * fVar29);
              fVar31 = fVar30 * fVar50 + (fVar31 - fVar50 * fVar31);
              *pfVar19 = (((fVar34 - fVar38) * fVar50 + fVar38) - fVar32) * fVar51 + fVar32;
              pfVar19[1] = (((fVar35 - fVar39) * fVar50 + fVar39) - fVar33) * fVar51 + fVar33;
              pfVar19[2] = (((fVar36 - fVar40) * fVar50 + fVar40) - fVar29) * fVar51 + fVar29;
              pfVar19[3] = (((fVar37 - fVar41) * fVar50 + fVar41) - fVar31) * fVar51 + fVar31;
              pfVar19 = pfVar19 + 4;
              pfVar21 = pfVar21 + 6;
            }
          }
        }
        goto LAB_0052c638;
      }
    }
    else {
      iVar24 = iVar14;
      if (!bVar25) goto LAB_0052c638;
      iVar22 = (this->super_GridSample).sample_type;
      if (iVar22 != 2) {
        if (iVar22 == 1) {
          iVar14 = this_00->h * this_00->w * this_00->d;
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          uVar17 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar17 = 0;
          }
          for (uVar18 = 0; iVar24 = 0, uVar18 != uVar17; uVar18 = uVar18 + 1) {
            lVar23 = src->cstep * uVar18 * src->elemsize;
            pvVar7 = src->data;
            pfVar19 = (float *)(this_00->cstep * uVar18 * this_00->elemsize + (long)this_00->data);
            pfVar21 = (float *)local_1b8.data;
            iVar22 = iVar14;
            while (bVar25 = iVar22 != 0, iVar22 = iVar22 + -1, bVar25) {
              fVar26 = 0.0;
              fVar27 = 0.0;
              fVar28 = 0.0;
              fVar30 = 0.0;
              fVar32 = 0.0;
              fVar33 = 0.0;
              fVar29 = 0.0;
              fVar31 = 0.0;
              if (-1 < (long)(int)*pfVar21) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)*pfVar21 * 4 + lVar23);
                fVar32 = *pfVar1;
                fVar33 = pfVar1[1];
                fVar29 = pfVar1[2];
                fVar31 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[1]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[1] * 4 + lVar23);
                fVar26 = *pfVar1;
                fVar27 = pfVar1[1];
                fVar28 = pfVar1[2];
                fVar30 = pfVar1[3];
              }
              fVar34 = 0.0;
              fVar35 = 0.0;
              fVar36 = 0.0;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              if (-1 < (long)(int)pfVar21[2]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[2] * 4 + lVar23);
                fVar38 = *pfVar1;
                fVar39 = pfVar1[1];
                fVar40 = pfVar1[2];
                fVar41 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[3]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[3] * 4 + lVar23);
                fVar34 = *pfVar1;
                fVar35 = pfVar1[1];
                fVar36 = pfVar1[2];
                fVar37 = pfVar1[3];
              }
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              fVar50 = 0.0;
              fVar51 = 0.0;
              fVar52 = 0.0;
              fVar53 = 0.0;
              if (-1 < (long)(int)pfVar21[4]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[4] * 4 + lVar23);
                fVar50 = *pfVar1;
                fVar51 = pfVar1[1];
                fVar52 = pfVar1[2];
                fVar53 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[5]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[5] * 4 + lVar23);
                fVar42 = *pfVar1;
                fVar43 = pfVar1[1];
                fVar44 = pfVar1[2];
                fVar45 = pfVar1[3];
              }
              fVar46 = 0.0;
              fVar47 = 0.0;
              fVar48 = 0.0;
              fVar49 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              if (-1 < (long)(int)pfVar21[6]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[6] * 4 + lVar23);
                fVar54 = *pfVar1;
                fVar55 = pfVar1[1];
                fVar56 = pfVar1[2];
                fVar57 = pfVar1[3];
              }
              if (-1 < (long)(int)pfVar21[7]) {
                pfVar1 = (float *)((long)pvVar7 + (long)(int)pfVar21[7] * 4 + lVar23);
                fVar46 = *pfVar1;
                fVar47 = pfVar1[1];
                fVar48 = pfVar1[2];
                fVar49 = pfVar1[3];
              }
              fVar2 = pfVar21[8];
              fVar3 = pfVar21[9];
              fVar4 = pfVar21[10];
              fVar32 = fVar26 * fVar2 + (fVar32 - fVar2 * fVar32);
              fVar33 = fVar27 * fVar2 + (fVar33 - fVar2 * fVar33);
              fVar29 = fVar28 * fVar2 + (fVar29 - fVar2 * fVar29);
              fVar31 = fVar30 * fVar2 + (fVar31 - fVar2 * fVar31);
              fVar26 = fVar42 * fVar2 + (fVar50 - fVar2 * fVar50);
              fVar27 = fVar43 * fVar2 + (fVar51 - fVar2 * fVar51);
              fVar28 = fVar44 * fVar2 + (fVar52 - fVar2 * fVar52);
              fVar30 = fVar45 * fVar2 + (fVar53 - fVar2 * fVar53);
              fVar32 = ((fVar34 - fVar38) * fVar2 + fVar38) * fVar3 + (fVar32 - fVar32 * fVar3);
              fVar33 = ((fVar35 - fVar39) * fVar2 + fVar39) * fVar3 + (fVar33 - fVar33 * fVar3);
              fVar29 = ((fVar36 - fVar40) * fVar2 + fVar40) * fVar3 + (fVar29 - fVar29 * fVar3);
              fVar31 = ((fVar37 - fVar41) * fVar2 + fVar41) * fVar3 + (fVar31 - fVar31 * fVar3);
              *pfVar19 = (((((fVar46 - fVar54) * fVar2 + fVar54) - fVar26) * fVar3 + fVar26) -
                         fVar32) * fVar4 + fVar32;
              pfVar19[1] = (((((fVar47 - fVar55) * fVar2 + fVar55) - fVar27) * fVar3 + fVar27) -
                           fVar33) * fVar4 + fVar33;
              pfVar19[2] = (((((fVar48 - fVar56) * fVar2 + fVar56) - fVar28) * fVar3 + fVar28) -
                           fVar29) * fVar4 + fVar29;
              pfVar19[3] = (((((fVar49 - fVar57) * fVar2 + fVar57) - fVar30) * fVar3 + fVar30) -
                           fVar31) * fVar4 + fVar31;
              pfVar19 = pfVar19 + 4;
              pfVar21 = pfVar21 + 0xb;
            }
          }
        }
        goto LAB_0052c638;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,&local_1b8,(Option *)(ulong)_elempack);
    iVar24 = iVar14;
  }
LAB_0052c638:
  piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        free(local_1b8.data);
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int GridSample_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}